

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathedit.cpp
# Opt level: O0

QStringList * __thiscall
QPathEdit::modelFilters
          (QStringList *__return_storage_ptr__,QPathEdit *this,QStringList *normalFilters)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  QString *other;
  QList<QString> *extraout_RDX;
  QList<QString> *extraout_RDX_00;
  QList<QString> *extraout_RDX_01;
  QList<QString> *extraout_RDX_02;
  QList<QString> *extraout_RDX_03;
  QList<QString> *t;
  QFlags<Qt::SplitBehaviorFlags> local_104;
  QString local_100;
  QList<QString> local_e8;
  QFlags<QRegularExpression::MatchOption> local_cc;
  QRegularExpressionMatch local_c8 [8];
  QRegularExpressionMatch match;
  QString filter;
  undefined1 local_a0 [8];
  QForeachContainer<QList<QString>_> _container_370;
  QString local_68;
  QFlags<QRegularExpression::PatternOption> local_50 [4];
  QString local_40;
  undefined1 local_21;
  QtPrivate *local_20;
  QStringList *normalFilters_local;
  QPathEdit *this_local;
  QStringList *res;
  
  local_21 = 0;
  local_20 = (QtPrivate *)normalFilters;
  normalFilters_local = (QStringList *)this;
  this_local = (QPathEdit *)__return_storage_ptr__;
  QList<QString>::QList(__return_storage_ptr__);
  t = extraout_RDX;
  if ((modelFilters(QList<QString>const&)::re == '\0') &&
     (iVar3 = __cxa_guard_acquire(&modelFilters(QList<QString>const&)::re), t = extraout_RDX_00,
     iVar3 != 0)) {
    QString::QString(&local_40,"^.*\\((.*)\\)$");
    QFlags<QRegularExpression::PatternOption>::QFlags(local_50,NoPatternOption);
    QRegularExpression::QRegularExpression
              ((QRegularExpression *)&modelFilters(QList<QString>const&)::re,&local_40,
               (QFlags_conflict1 *)(ulong)local_50[0].i);
    QString::~QString(&local_40);
    __cxa_atexit(QRegularExpression::~QRegularExpression,&modelFilters(QList<QString>const&)::re,
                 &__dso_handle);
    __cxa_guard_release(&modelFilters(QList<QString>const&)::re);
    t = extraout_RDX_01;
  }
  if ((modelFilters(QList<QString>const&)::re2 == '\0') &&
     (iVar3 = __cxa_guard_acquire(&modelFilters(QList<QString>const&)::re2), t = extraout_RDX_02,
     iVar3 != 0)) {
    QString::QString(&local_68,"\\s");
    QFlags<QRegularExpression::PatternOption>::QFlags
              ((QFlags<QRegularExpression::PatternOption> *)&_container_370.field_0x2c,
               NoPatternOption);
    QRegularExpression::QRegularExpression
              ((QRegularExpression *)&modelFilters(QList<QString>const&)::re2,&local_68,
               (QFlags_conflict1 *)(ulong)(uint)_container_370._44_4_);
    QString::~QString(&local_68);
    __cxa_atexit(QRegularExpression::~QRegularExpression,&modelFilters(QList<QString>const&)::re2,
                 &__dso_handle);
    __cxa_guard_release(&modelFilters(QList<QString>const&)::re2);
    t = extraout_RDX_03;
  }
  QtPrivate::qMakeForeachContainer<QList<QString>const&>
            ((QForeachContainer<QList<QString>_> *)local_a0,local_20,t);
  while (bVar1 = QList<QString>::const_iterator::operator!=
                           ((const_iterator *)&_container_370.c.d.size,_container_370.i), bVar1) {
    other = QList<QString>::const_iterator::operator*((const_iterator *)&_container_370.c.d.size);
    QString::QString((QString *)&match,other);
    QFlags<QRegularExpression::MatchOption>::QFlags(&local_cc,NoMatchOption);
    QRegularExpression::match
              (local_c8,&modelFilters(QList<QString>const&)::re,&match,0,0,local_cc.i);
    bVar2 = QRegularExpressionMatch::hasMatch();
    if ((bVar2 & 1) != 0) {
      QRegularExpressionMatch::captured((int)&local_100);
      QFlags<Qt::SplitBehaviorFlags>::QFlags(&local_104,KeepEmptyParts);
      QString::split((QRegularExpression *)&local_e8,(QFlags_conflict1 *)&local_100);
      QList<QString>::append(__return_storage_ptr__,&local_e8);
      QList<QString>::~QList(&local_e8);
      QString::~QString(&local_100);
    }
    QRegularExpressionMatch::~QRegularExpressionMatch(local_c8);
    QString::~QString((QString *)&match);
    QList<QString>::const_iterator::operator++((const_iterator *)&_container_370.c.d.size);
  }
  QtPrivate::QForeachContainer<QList<QString>_>::~QForeachContainer
            ((QForeachContainer<QList<QString>_> *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

QStringList QPathEdit::modelFilters(const QStringList &normalFilters) {
	QStringList res;
    static QRegularExpression re = QRegularExpression("^.*\\((.*)\\)$");
    static QRegularExpression re2 = QRegularExpression("\\s");
    foreach(QString filter, normalFilters) {
        QRegularExpressionMatch match = re.match(filter);
        if(match.hasMatch()) {
            res.append(match.captured(1).split(re2));
        }
	}
	return res;
}